

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DPFSP.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  rep __val;
  ostream *poVar4;
  rep_conflict rVar5;
  char *local_548;
  ushort local_45a;
  ostream local_458 [6];
  unsigned_short i;
  ofstream file;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_258;
  duration<long,_std::ratio<1L,_1000000000L>_> local_250;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string nomeReport;
  string percorso;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_1a0;
  int posizione;
  duration<long,_std::ratio<1L,_1000000000L>_> local_198;
  duration<double,_std::ratio<1L,_1L>_> local_190;
  sec durata;
  Permutazione migliorIndividuo;
  undefined1 local_150 [8];
  ADE_DEP_DPFSP adeDep;
  time_point tempoIniziale;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  size_t local_68;
  size_t pos;
  string percorsoFile;
  double dStack_38;
  bool normalizzazione;
  double Fmax;
  double theta;
  ushort local_1e;
  uint nIndividui;
  unsigned_short scalaElaborazione;
  uint seed;
  char **argv_local;
  int argc_local;
  
  nIndividui = 0;
  local_1e = 100;
  theta._4_4_ = 0x32;
  Fmax = 0.0;
  dStack_38 = 1.2;
  percorsoFile.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)&pos);
  switch(argc) {
  case 1:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Devi inserire il percorso del file!");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(-1);
  default:
    pcVar1 = argv[7];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
    nIndividui = std::__cxx11::stoi(&local_88,&local_68,10);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  case 7:
    pcVar1 = argv[6];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar1,&local_c1);
    iVar3 = std::__cxx11::stoi(&local_c0,&local_68,10);
    percorsoFile.field_2._M_local_buf[0xf] = iVar3 != 0;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  case 6:
    dStack_38 = strtod(argv[5],(char **)0x0);
  case 5:
    Fmax = strtod(argv[4],(char **)0x0);
  case 4:
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar1,&local_e9);
    iVar3 = std::__cxx11::stoi(&local_e8,&local_68,10);
    local_1e = (ushort)iVar3;
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  case 3:
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,pcVar1,(allocator<char> *)((long)&tempoIniziale.__d.__r + 7));
    theta._4_4_ = std::__cxx11::stoi(&local_110,&local_68,10);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tempoIniziale.__d.__r + 7));
  case 2:
    std::__cxx11::string::operator=((string *)&pos,argv[1]);
    adeDep.istanza.minp = (uint *)std::chrono::_V2::system_clock::now();
    std::__cxx11::string::string((string *)&migliorIndividuo.dimensione,(string *)&pos);
    ADE_DEP_DPFSP::ADE_DEP_DPFSP((ADE_DEP_DPFSP *)local_150,(string *)&migliorIndividuo.dimensione);
    std::__cxx11::string::~string((string *)&migliorIndividuo.dimensione);
    ADE_DEP_DPFSP::esegui
              ((Permutazione *)&durata,(ADE_DEP_DPFSP *)local_150,theta._4_2_,local_1e,Fmax,0.1,
               dStack_38,(bool)(percorsoFile.field_2._M_local_buf[0xf] & 1),nIndividui);
    tStack_1a0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_198.__r =
         (rep)std::chrono::operator-
                        (&stack0xfffffffffffffe60,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&adeDep.istanza.minp);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_190,&local_198);
    std::__cxx11::string::find_last_of((char *)&pos,0x11105c);
    std::__cxx11::string::substr((ulong)((long)&nomeReport.field_2 + 8),(ulong)&pos);
    std::operator+(&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&nomeReport.field_2 + 8),"_report-");
    local_258.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_250.__r =
         (rep)std::chrono::
              time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::time_since_epoch(&local_258);
    __val = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_250);
    std::__cxx11::to_string(&local_248,__val);
    std::operator+(&local_208,&local_228,&local_248);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   &local_208,".csv");
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::ofstream::ofstream(local_458,local_1e8,0x10);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) != 0) {
      poVar4 = std::operator<<(local_458,
                               "Fabbriche; Lavori; Macchine; Numero individui; Scala elaborazione; Theta; Fmax; Normalizzazione; Seed (0 se random); Durata (secondi); Miglior punteggio; Individuo;"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = (ostream *)
               std::ostream::operator<<(local_458,adeDep.super_ADE<Permutazione>.seed._2_2_);
      std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(local_458,adeDep.super_ADE<Permutazione>._20_2_);
      std::operator<<(poVar4,";");
      poVar4 = (ostream *)
               std::ostream::operator<<(local_458,(ushort)adeDep.super_ADE<Permutazione>.seed);
      std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(local_458,theta._4_4_);
      std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(local_458,local_1e);
      std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(local_458,Fmax);
      std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(local_458,dStack_38);
      std::operator<<(poVar4,";");
      if ((percorsoFile.field_2._M_local_buf[0xf] & 1U) == 0) {
        local_548 = "No";
      }
      else {
        local_548 = "Si";
      }
      poVar4 = std::operator<<(local_458,local_548);
      std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(local_458,nIndividui);
      std::operator<<(poVar4,";");
      rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_190);
      poVar4 = (ostream *)std::ostream::operator<<(local_458,rVar5);
      std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(local_458,migliorIndividuo.individuo._4_4_);
      std::operator<<(poVar4,";");
      for (local_45a = 0; local_45a < (ushort)migliorIndividuo.individuo; local_45a = local_45a + 1)
      {
        std::ostream::operator<<
                  (local_458,
                   *(ushort *)((long)migliorIndividuo._vptr_Permutazione + (ulong)local_45a * 2));
        if ((uint)local_45a != (ushort)migliorIndividuo.individuo - 1) {
          std::operator<<(local_458,",");
        }
      }
      poVar4 = std::operator<<(local_458,";");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ofstream::close();
    }
    std::ofstream::~ofstream(local_458);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)(nomeReport.field_2._M_local_buf + 8));
    Permutazione::~Permutazione((Permutazione *)&durata);
    ADE_DEP_DPFSP::~ADE_DEP_DPFSP((ADE_DEP_DPFSP *)local_150);
    std::__cxx11::string::~string((string *)&pos);
    return 0;
  }
}

Assistant:

int main(int argc, char* argv[])
{
	unsigned int seed = 0;
	unsigned short scalaElaborazione = 100;
	unsigned int nIndividui = 50;
	double theta = 0;
	double Fmax = 1.2;
	bool normalizzazione = false;
	string percorsoFile;

	size_t pos;

	switch (argc) {
		default:
		case 8:
			seed = stoi(argv[7], &pos);
		case 7:
			normalizzazione = stoi(argv[6], &pos);
		case 6:
			Fmax = strtod(argv[5], NULL);
		case 5:
			theta = strtod(argv[4], NULL);
		case 4:
			scalaElaborazione = stoi(argv[3], &pos);
		case 3:
			nIndividui = stoi(argv[2], &pos);
		case 2:
			percorsoFile = argv[1];
			break;
		case 1:
			cerr << "Devi inserire il percorso del file!" << endl << endl;
			exit(-1);
	}

	/*
	cout << endl << endl;
	cout << "Il programma sara' eseguito con queste impostazioni:" << endl << endl;
	cout << "Percorso file: " << percorsoFile << endl;
	cout << "Numero individui: " << nIndividui << endl;
	cout << "Scala elaborazione: " << scalaElaborazione << endl;
	cout << "Theta: " << theta << endl;
	cout << "F massimo: " << Fmax << endl;
	cout << "Normalizzazione attiva: " << (normalizzazione ? "Si" : "No") << endl;

	if(seed > 0) cout << "Seed: " << seed << endl;
	else cout << "Seed: " << "Random" << endl << endl;
	*/

	using orologio = std::chrono::system_clock;
	using sec = std::chrono::duration<double>;

	const auto tempoIniziale = orologio::now();


	//percorsoFile = "C:/users/edu4r/Desktop/DPFSP_Large/5/Ta016_5.txt";

	ADE_DEP_DPFSP adeDep(percorsoFile);
	Permutazione migliorIndividuo = adeDep.esegui(nIndividui, scalaElaborazione, theta, 0.1, Fmax, 
		normalizzazione, seed);

	const sec durata = orologio::now() - tempoIniziale;

	//Stampo a video le informazioni

	/*
	cout << "Risultati: " << endl << endl;
	cout << "Tempo speso: " << durata.count() << " secondi" << endl;
	cout << "Individuo: ";
	migliorIndividuo.stampa();
	cout << "Punteggio: " << migliorIndividuo.score << endl << endl;
	
	exit(0);
	*/
	

	//Salvo le informazioni su un CSV

	int posizione = percorsoFile.find_last_of(".");
	string percorso = percorsoFile.substr(0, posizione);

	string nomeReport = percorso + "_report-" + to_string(orologio::now().time_since_epoch().count()) + ".csv";

	ofstream file(nomeReport);
	
	if (file.is_open()) {
		file << "Fabbriche; Lavori; Macchine; Numero individui; Scala elaborazione; Theta; Fmax; Normalizzazione; Seed (0 se random); Durata (secondi); Miglior punteggio; Individuo;" << endl;

		file << adeDep.istanza.fabbriche << ";";
		file << adeDep.istanza.lavori << ";";
		file << adeDep.istanza.macchine << ";";
		file << nIndividui << ";";
		file << scalaElaborazione << ";";
		file << theta << ";";
		file << Fmax << ";";
		file << (normalizzazione ? "Si" : "No") << ";";
		file << seed << ";";
		file << durata.count() << ";";
		file << migliorIndividuo.score << ";";

		for (unsigned short i = 0; i < migliorIndividuo.dimensione; i++) {
			file << migliorIndividuo.individuo[i];
			if (i != migliorIndividuo.dimensione - 1) file << ",";
		}

		file << ";" << endl;

		file.close();
	}

	//cout << "Risultati salvati in: " << nomeReport << endl << endl;

	return 0;
}